

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_enc.c
# Opt level: O0

int ASN1_item_ex_i2d(ASN1_VALUE **pval,uchar **out,ASN1_ITEM *it,int tag,int aclass)

{
  void *pvVar1;
  uint aclass_00;
  int iVar2;
  int iVar3;
  ASN1_TEMPLATE *tt_00;
  ASN1_ITEM *it_00;
  ASN1_VALUE **pseqval_1;
  ASN1_TEMPLATE *seqtt_1;
  int tmplen;
  ASN1_VALUE **pseqval;
  ASN1_TEMPLATE *seqtt;
  ASN1_TEMPLATE *chtt;
  ASN1_VALUE **pchval;
  ASN1_aux_const_cb *asn1_cb;
  ASN1_AUX *aux;
  ASN1_EXTERN_FUNCS *ef;
  int ndef;
  int seqlen;
  int seqcontlen;
  int i;
  ASN1_TEMPLATE *tt;
  ASN1_ITEM *in_stack_ffffffffffffff68;
  uchar **in_stack_ffffffffffffff70;
  ASN1_TEMPLATE *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  ASN1_VALUE *in_stack_ffffffffffffff88;
  ASN1_ITEM *local_58;
  int local_40;
  int local_38;
  int local_34;
  uint local_28;
  int local_24;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_40 = 1;
  pvVar1 = it->funcs;
  local_58 = (ASN1_ITEM *)0x0;
  if ((it->itype == '\0') || (*pval != (ASN1_VALUE *)0x0)) {
    if (pvVar1 != (void *)0x0) {
      if ((*(uint *)((long)pvVar1 + 8) & 8) == 0) {
        in_stack_ffffffffffffff68 = *(ASN1_ITEM **)((long)pvVar1 + 0x18);
        local_58 = in_stack_ffffffffffffff68;
      }
      else {
        in_stack_ffffffffffffff68 = *(ASN1_ITEM **)((long)pvVar1 + 0x28);
        local_58 = in_stack_ffffffffffffff68;
      }
    }
    aclass_00 = (uint)it->itype;
    it_00 = (ASN1_ITEM *)(ulong)aclass_00;
    switch(it_00) {
    case (ASN1_ITEM *)0x0:
      if (it->templates == (ASN1_TEMPLATE *)0x0) {
        iVar3 = asn1_i2d_ex_primitive
                          ((ASN1_VALUE **)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                           in_stack_ffffffffffffff68,0,aclass_00);
      }
      else {
        iVar3 = asn1_template_ex_i2d
                          ((ASN1_VALUE **)
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                           (uchar **)pval,(ASN1_TEMPLATE *)out,(int)((ulong)it >> 0x20),(int)it);
      }
      break;
    case (ASN1_ITEM *)0x2:
      if (tag == -1) {
        if ((local_58 == (ASN1_ITEM *)0x0) || (iVar3 = (*(code *)local_58)(6,pval,it,0), iVar3 != 0)
           ) {
          iVar3 = ossl_asn1_get_choice_selector_const((ASN1_VALUE **)pval,(ASN1_ITEM *)it);
          if ((iVar3 < 0) || (it->tcount <= (long)iVar3)) {
            if ((local_58 == (ASN1_ITEM *)0x0) ||
               (iVar3 = (*(code *)local_58)(7,pval,it,0), iVar3 != 0)) {
              iVar3 = 0;
            }
            else {
              iVar3 = 0;
            }
          }
          else {
            ossl_asn1_get_const_field_ptr
                      ((ASN1_VALUE **)pval,(ASN1_TEMPLATE *)(it->templates + iVar3));
            iVar3 = asn1_template_ex_i2d
                              ((ASN1_VALUE **)
                               CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                               (uchar **)pval,(ASN1_TEMPLATE *)out,(int)((ulong)it >> 0x20),(int)it)
            ;
          }
        }
        else {
          iVar3 = 0;
        }
      }
      else {
        ERR_new();
        ERR_set_debug((char *)in_stack_ffffffffffffff70,
                      (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),&it_00->itype);
        ERR_set_error(0xd,0xe6,(char *)0x0);
        iVar3 = -1;
      }
      break;
    default:
      iVar3 = 0;
      break;
    case (ASN1_ITEM *)0x4:
      iVar3 = (**(code **)((long)it->funcs + 0x28))(pval,out,it,tag,aclass);
      break;
    case (ASN1_ITEM *)0x5:
      if (tag == -1) {
        iVar3 = asn1_i2d_ex_primitive
                          ((ASN1_VALUE **)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                           in_stack_ffffffffffffff68,0,aclass_00);
      }
      else {
        ERR_new();
        ERR_set_debug((char *)in_stack_ffffffffffffff70,
                      (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),&it_00->itype);
        ERR_set_error(0xd,0xe6,(char *)0x0);
        iVar3 = -1;
      }
      break;
    case (ASN1_ITEM *)0x6:
      if ((aclass & 0x800U) != 0) {
        local_40 = 2;
      }
    case (ASN1_ITEM *)0x1:
      iVar2 = ossl_asn1_enc_restore
                        ((int *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                         (ASN1_VALUE **)in_stack_ffffffffffffff68,it_00);
      if (iVar2 < 0) {
        iVar3 = 0;
      }
      else {
        iVar3 = local_38;
        if (iVar2 < 1) {
          local_38 = 0;
          local_28 = aclass;
          local_24 = tag;
          if (tag == -1) {
            local_24 = 0x10;
            local_28 = aclass & 0xffffff3f;
          }
          if ((local_58 == (ASN1_ITEM *)0x0) ||
             (iVar3 = (*(code *)local_58)(6,pval,it,0), iVar3 != 0)) {
            for (local_34 = 0; (long)local_34 < it->tcount; local_34 = local_34 + 1) {
              tt_00 = ossl_asn1_do_adb(in_stack_ffffffffffffff88,
                                       (ASN1_TEMPLATE *)
                                       CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                                       ,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
              if (tt_00 == (ASN1_TEMPLATE *)0x0) {
                return 0;
              }
              in_stack_ffffffffffffff88 =
                   (ASN1_VALUE *)ossl_asn1_get_const_field_ptr((ASN1_VALUE **)pval,tt_00);
              in_stack_ffffffffffffff84 =
                   asn1_template_ex_i2d
                             ((ASN1_VALUE **)
                              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                              (uchar **)pval,(ASN1_TEMPLATE *)out,(int)((ulong)it >> 0x20),(int)it);
              if ((in_stack_ffffffffffffff84 == -1) ||
                 (0x7fffffff - local_38 < in_stack_ffffffffffffff84)) {
                return -1;
              }
              local_38 = in_stack_ffffffffffffff84 + local_38;
            }
            iVar3 = ASN1_object_size(local_40,local_38,local_24);
            if (((ASN1_TEMPLATE *)out != (ASN1_TEMPLATE *)0x0) && (iVar3 != -1)) {
              ASN1_put_object(out,local_40,local_38,local_24,local_28);
              for (local_34 = 0; (long)local_34 < it->tcount; local_34 = local_34 + 1) {
                in_stack_ffffffffffffff78 =
                     ossl_asn1_do_adb(in_stack_ffffffffffffff88,
                                      (ASN1_TEMPLATE *)
                                      CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                      (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
                if (in_stack_ffffffffffffff78 == (ASN1_TEMPLATE *)0x0) {
                  return 0;
                }
                ossl_asn1_get_const_field_ptr((ASN1_VALUE **)pval,in_stack_ffffffffffffff78);
                asn1_template_ex_i2d
                          ((ASN1_VALUE **)
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                           (uchar **)pval,(ASN1_TEMPLATE *)out,(int)((ulong)it >> 0x20),(int)it);
              }
              if (local_40 == 2) {
                ASN1_put_eoc(out);
              }
              if ((local_58 != (ASN1_ITEM *)0x0) &&
                 (iVar2 = (*(code *)local_58)(7,pval,it,0), iVar2 == 0)) {
                iVar3 = 0;
              }
            }
          }
          else {
            iVar3 = 0;
          }
        }
      }
    }
  }
  else {
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int ASN1_item_ex_i2d(const ASN1_VALUE **pval, unsigned char **out,
                     const ASN1_ITEM *it, int tag, int aclass)
{
    const ASN1_TEMPLATE *tt = NULL;
    int i, seqcontlen, seqlen, ndef = 1;
    const ASN1_EXTERN_FUNCS *ef;
    const ASN1_AUX *aux = it->funcs;
    ASN1_aux_const_cb *asn1_cb = NULL;

    if ((it->itype != ASN1_ITYPE_PRIMITIVE) && *pval == NULL)
        return 0;

    if (aux != NULL) {
        asn1_cb = ((aux->flags & ASN1_AFLG_CONST_CB) != 0) ? aux->asn1_const_cb
            : (ASN1_aux_const_cb *)aux->asn1_cb; /* backward compatibility */
    }

    switch (it->itype) {

    case ASN1_ITYPE_PRIMITIVE:
        if (it->templates)
            return asn1_template_ex_i2d(pval, out, it->templates,
                                        tag, aclass);
        return asn1_i2d_ex_primitive(pval, out, it, tag, aclass);

    case ASN1_ITYPE_MSTRING:
        /*
         * It never makes sense for multi-strings to have implicit tagging, so
         * if tag != -1, then this looks like an error in the template.
         */
        if (tag != -1) {
            ERR_raise(ERR_LIB_ASN1, ASN1_R_BAD_TEMPLATE);
            return -1;
        }
        return asn1_i2d_ex_primitive(pval, out, it, -1, aclass);

    case ASN1_ITYPE_CHOICE:
        /*
         * It never makes sense for CHOICE types to have implicit tagging, so
         * if tag != -1, then this looks like an error in the template.
         */
        if (tag != -1) {
            ERR_raise(ERR_LIB_ASN1, ASN1_R_BAD_TEMPLATE);
            return -1;
        }
        if (asn1_cb && !asn1_cb(ASN1_OP_I2D_PRE, pval, it, NULL))
            return 0;
        i = ossl_asn1_get_choice_selector_const(pval, it);
        if ((i >= 0) && (i < it->tcount)) {
            const ASN1_VALUE **pchval;
            const ASN1_TEMPLATE *chtt;
            chtt = it->templates + i;
            pchval = ossl_asn1_get_const_field_ptr(pval, chtt);
            return asn1_template_ex_i2d(pchval, out, chtt, -1, aclass);
        }
        /* Fixme: error condition if selector out of range */
        if (asn1_cb && !asn1_cb(ASN1_OP_I2D_POST, pval, it, NULL))
            return 0;
        break;

    case ASN1_ITYPE_EXTERN:
        /* If new style i2d it does all the work */
        ef = it->funcs;
        return ef->asn1_ex_i2d(pval, out, it, tag, aclass);

    case ASN1_ITYPE_NDEF_SEQUENCE:
        /* Use indefinite length constructed if requested */
        if (aclass & ASN1_TFLG_NDEF)
            ndef = 2;
        /* fall through */

    case ASN1_ITYPE_SEQUENCE:
        i = ossl_asn1_enc_restore(&seqcontlen, out, pval, it);
        /* An error occurred */
        if (i < 0)
            return 0;
        /* We have a valid cached encoding... */
        if (i > 0)
            return seqcontlen;
        /* Otherwise carry on */
        seqcontlen = 0;
        /* If no IMPLICIT tagging set to SEQUENCE, UNIVERSAL */
        if (tag == -1) {
            tag = V_ASN1_SEQUENCE;
            /* Retain any other flags in aclass */
            aclass = (aclass & ~ASN1_TFLG_TAG_CLASS)
                | V_ASN1_UNIVERSAL;
        }
        if (asn1_cb && !asn1_cb(ASN1_OP_I2D_PRE, pval, it, NULL))
            return 0;
        /* First work out sequence content length */
        for (i = 0, tt = it->templates; i < it->tcount; tt++, i++) {
            const ASN1_TEMPLATE *seqtt;
            const ASN1_VALUE **pseqval;
            int tmplen;
            seqtt = ossl_asn1_do_adb(*pval, tt, 1);
            if (!seqtt)
                return 0;
            pseqval = ossl_asn1_get_const_field_ptr(pval, seqtt);
            tmplen = asn1_template_ex_i2d(pseqval, NULL, seqtt, -1, aclass);
            if (tmplen == -1 || (tmplen > INT_MAX - seqcontlen))
                return -1;
            seqcontlen += tmplen;
        }

        seqlen = ASN1_object_size(ndef, seqcontlen, tag);
        if (!out || seqlen == -1)
            return seqlen;
        /* Output SEQUENCE header */
        ASN1_put_object(out, ndef, seqcontlen, tag, aclass);
        for (i = 0, tt = it->templates; i < it->tcount; tt++, i++) {
            const ASN1_TEMPLATE *seqtt;
            const ASN1_VALUE **pseqval;
            seqtt = ossl_asn1_do_adb(*pval, tt, 1);
            if (!seqtt)
                return 0;
            pseqval = ossl_asn1_get_const_field_ptr(pval, seqtt);
            /* FIXME: check for errors in enhanced version */
            asn1_template_ex_i2d(pseqval, out, seqtt, -1, aclass);
        }
        if (ndef == 2)
            ASN1_put_eoc(out);
        if (asn1_cb && !asn1_cb(ASN1_OP_I2D_POST, pval, it, NULL))
            return 0;
        return seqlen;

    default:
        return 0;

    }
    return 0;
}